

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmTable.c
# Opt level: O1

int Nm_ManTableAdd(Nm_Man_t *p,Nm_Entry_t *pEntry)

{
  Nm_Entry_t **ppNVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Nm_Entry_t **ppNVar5;
  Nm_Entry_t **__s;
  Nm_Entry_t *pNVar6;
  Nm_Entry_t *pNVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  Nm_Entry_t *pNVar13;
  ulong uVar14;
  char cVar15;
  size_t __size;
  timespec ts;
  timespec local_40;
  
  if (p->nSizeFactor * p->nBins < p->nEntries) {
    clock_gettime(3,&local_40);
    uVar4 = p->nBins;
    uVar3 = p->nGrowthFactor * uVar4 - 1;
    while( true ) {
      do {
        uVar11 = uVar3 + 1;
        uVar2 = uVar3 & 1;
        uVar3 = uVar11;
      } while (uVar2 != 0);
      if (uVar11 < 9) break;
      iVar9 = 5;
      while (uVar11 % (iVar9 - 2U) != 0) {
        uVar2 = iVar9 * iVar9;
        iVar9 = iVar9 + 2;
        if (uVar11 < uVar2) goto LAB_004a0215;
      }
    }
LAB_004a0215:
    __size = (long)(int)uVar11 << 3;
    ppNVar5 = (Nm_Entry_t **)malloc(__size);
    __s = (Nm_Entry_t **)malloc(__size);
    iVar9 = 0;
    memset(ppNVar5,0,__size);
    memset(__s,0,__size);
    if (0 < (int)uVar4) {
      ppNVar1 = p->pBinsI2N;
      uVar12 = 0;
      iVar9 = 0;
      do {
        pNVar6 = ppNVar1[uVar12];
        if (pNVar6 != (Nm_Entry_t *)0x0) {
          pNVar7 = pNVar6->pNextI2N;
          do {
            pNVar13 = pNVar7;
            uVar3 = pNVar6->ObjId;
            uVar10 = (ulong)((uVar3 >> 0x18) * 0x161 ^ (uVar3 & 0xff) * 0x1f01 ^
                             (uVar3 >> 8 & 0xff) * 0xb9b ^ (uVar3 >> 0x10 & 0xff) * 0x38f) %
                     (ulong)uVar11;
            pNVar6->pNextI2N = ppNVar5[uVar10];
            ppNVar5[uVar10] = pNVar6;
            if (pNVar13 == (Nm_Entry_t *)0x0) {
              pNVar7 = (Nm_Entry_t *)0x0;
            }
            else {
              pNVar7 = pNVar13->pNextI2N;
            }
            iVar9 = iVar9 + 1;
            pNVar6 = pNVar13;
          } while (pNVar13 != (Nm_Entry_t *)0x0);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar4);
    }
    if (0 < (int)uVar4) {
      ppNVar1 = p->pBinsN2I;
      uVar12 = 0;
      do {
        pNVar6 = ppNVar1[uVar12];
        if (pNVar6 != (Nm_Entry_t *)0x0) {
          pNVar7 = pNVar6->pNextN2I;
          while( true ) {
            pNVar13 = pNVar7;
            cVar15 = (char)pNVar6[1].Type;
            uVar3 = 0;
            if (cVar15 != '\0') {
              uVar10 = 1;
              uVar14 = 0;
              do {
                uVar3 = uVar3 ^ (int)cVar15 * (int)cVar15 *
                                (&Nm_HashString_s_Primes)
                                [(uint)(~((int)(uVar14 / 10) * 10) + (int)uVar10)];
                uVar14 = (ulong)((int)uVar14 + 1);
                cVar15 = *(char *)((long)&pNVar6[1].Type + uVar10);
                uVar10 = (ulong)((int)uVar10 + 1);
              } while (cVar15 != '\0');
            }
            pNVar6->pNextN2I = __s[(ulong)uVar3 % (ulong)uVar11];
            __s[(ulong)uVar3 % (ulong)uVar11] = pNVar6;
            if (pNVar13 == (Nm_Entry_t *)0x0) break;
            pNVar7 = pNVar13->pNextN2I;
            pNVar6 = pNVar13;
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar4);
    }
    if (iVar9 != p->nEntries) {
      __assert_fail("Counter == p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                    ,0x122,"void Nm_ManResize(Nm_Man_t *)");
    }
    if (p->pBinsI2N != (Nm_Entry_t **)0x0) {
      free(p->pBinsI2N);
      p->pBinsI2N = (Nm_Entry_t **)0x0;
    }
    if (p->pBinsN2I != (Nm_Entry_t **)0x0) {
      free(p->pBinsN2I);
      p->pBinsN2I = (Nm_Entry_t **)0x0;
    }
    p->pBinsI2N = ppNVar5;
    p->pBinsN2I = __s;
    p->nBins = uVar11;
  }
  uVar4 = pEntry->ObjId;
  pNVar6 = Nm_ManTableLookupId(p,uVar4);
  if (pNVar6 == (Nm_Entry_t *)0x0) {
    ppNVar5 = p->pBinsI2N;
    uVar3 = p->nBins;
    uVar2 = 0;
    uVar12 = (ulong)((uVar4 >> 0x18) * 0x161 ^ (uVar4 & 0xff) * 0x1f01 ^ (uVar4 >> 8 & 0xff) * 0xb9b
                    ^ (uVar4 >> 0x10 & 0xff) * 0x38f) % (ulong)uVar3;
    pEntry->pNextI2N = ppNVar5[uVar12];
    ppNVar5[uVar12] = pEntry;
    pNVar6 = pEntry + 1;
    pNVar7 = Nm_ManTableLookupName(p,(char *)pNVar6,-1);
    if (pNVar7 == (Nm_Entry_t *)0x0) {
      cVar15 = (char)pNVar6->Type;
      if (cVar15 != '\0') {
        uVar2 = 0;
        uVar4 = 1;
        uVar11 = 0;
        do {
          uVar2 = uVar2 ^ (int)cVar15 * (int)cVar15 *
                          (&Nm_HashString_s_Primes)[~((uVar11 / 10) * 10) + uVar4];
          uVar11 = uVar11 + 1;
          cVar15 = *(char *)((long)&pNVar6->Type + (ulong)uVar4);
          uVar4 = uVar4 + 1;
        } while (cVar15 != '\0');
      }
      ppNVar5 = p->pBinsN2I + (ulong)uVar2 % (ulong)uVar3;
      pNVar6 = *ppNVar5;
      lVar8 = 0x10;
    }
    else {
      ppNVar5 = &pNVar7->pNameSake;
      pNVar6 = pNVar7->pNameSake;
      if (pNVar7->pNameSake == (Nm_Entry_t *)0x0) {
        pNVar6 = pNVar7;
      }
      lVar8 = 0x18;
    }
    *(Nm_Entry_t **)((long)&pEntry->Type + lVar8) = pNVar6;
    *ppNVar5 = pEntry;
    p->nEntries = p->nEntries + 1;
    return 1;
  }
  __assert_fail("Nm_ManTableLookupId(p, pEntry->ObjId) == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                ,0x4e,"int Nm_ManTableAdd(Nm_Man_t *, Nm_Entry_t *)");
}

Assistant:

int Nm_ManTableAdd( Nm_Man_t * p, Nm_Entry_t * pEntry )
{
    Nm_Entry_t ** ppSpot, * pOther;
    // resize the tables if needed
    if ( p->nEntries > p->nBins * p->nSizeFactor )
        Nm_ManResize( p );
    // add the entry to the table Id->Name
    assert( Nm_ManTableLookupId(p, pEntry->ObjId) == NULL );
    ppSpot = p->pBinsI2N + Nm_HashNumber(pEntry->ObjId, p->nBins);
    pEntry->pNextI2N = *ppSpot;
    *ppSpot = pEntry;
    // check if an entry with the same name already exists
    if ( (pOther = Nm_ManTableLookupName(p, pEntry->Name, -1)) )
    {
        // entry with the same name already exists - add it to the ring
        pEntry->pNameSake = pOther->pNameSake? pOther->pNameSake : pOther;
        pOther->pNameSake = pEntry;
    }
    else
    {
        // entry with the same name does not exist - add it to the table
        ppSpot = p->pBinsN2I + Nm_HashString(pEntry->Name, p->nBins);
        pEntry->pNextN2I = *ppSpot;
        *ppSpot = pEntry;
    }
    // report successfully added entry
    p->nEntries++;
    return 1;
}